

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# no_field_presence_map_test.cc
# Opt level: O2

void __thiscall
google::protobuf::anon_unknown_0::NoFieldPresenceTest_TestNonZeroIntMapEntriesHaveNoPresence_Test::
TestBody(NoFieldPresenceTest_TestNonZeroIntMapEntriesHaveNoPresence_Test *this)

{
  Reflection *this_00;
  Descriptor *this_01;
  FieldDescriptor *field;
  Map<int,_proto2_nofieldpresence_unittest::ForeignEnum> *this_02;
  ForeignEnum *pFVar1;
  Message *x;
  char *pcVar2;
  string_view name;
  AssertHelper AStack_108;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_100;
  AssertionResult gtest_ar;
  TestAllMapTypes message;
  
  proto2_nofieldpresence_unittest::TestAllMapTypes::TestAllMapTypes(&message);
  this_00 = proto2_nofieldpresence_unittest::TestAllMapTypes::GetReflection();
  this_01 = proto2_nofieldpresence_unittest::TestAllMapTypes::GetDescriptor();
  name._M_str = "map_int32_foreign_enum";
  name._M_len = 0x16;
  field = Descriptor::FindFieldByName(this_01,name);
  this_02 = internal::TypeDefinedMapFieldBase<int,_proto2_nofieldpresence_unittest::ForeignEnum>::
            MutableMap(&message.field_0._impl_.map_int32_foreign_enum_.
                        super_TypeDefinedMapFieldBase<int,_proto2_nofieldpresence_unittest::ForeignEnum>
                      );
  gtest_ar.success_ = true;
  gtest_ar._1_3_ = 0;
  pFVar1 = Map<int,_proto2_nofieldpresence_unittest::ForeignEnum>::operator[]<int>
                     (this_02,(key_arg<int> *)&gtest_ar);
  *pFVar1 = FOREIGN_BAZ;
  x = Reflection::GetRepeatedMessage(this_00,&message.super_Message,field,0);
  testing::internal::
  PredicateFormatterFromMatcher<testing::internal::NotMatcher<google::protobuf::(anonymous_namespace)::MapEntryKeyExplicitPresenceMatcher>>
  ::operator()(&gtest_ar,"enum_map_entry",x);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_100);
    if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )gtest_ar.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl ==
        (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )0x0) {
      pcVar2 = anon_var_dwarf_651463 + 5;
    }
    else {
      pcVar2 = *(char **)gtest_ar.message_._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl;
    }
    testing::internal::AssertHelper::AssertHelper
              (&AStack_108,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/no_field_presence_map_test.cc"
               ,0x116,pcVar2);
    testing::internal::AssertHelper::operator=(&AStack_108,(Message *)&local_100);
    testing::internal::AssertHelper::~AssertHelper(&AStack_108);
    if (local_100._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_100._M_head_impl + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar.message_);
  testing::internal::
  PredicateFormatterFromMatcher<testing::internal::NotMatcher<google::protobuf::(anonymous_namespace)::MapEntryValueExplicitPresenceMatcher>>
  ::operator()(&gtest_ar,"enum_map_entry",x);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_100);
    if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )gtest_ar.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl ==
        (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )0x0) {
      pcVar2 = anon_var_dwarf_651463 + 5;
    }
    else {
      pcVar2 = *(char **)gtest_ar.message_._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl;
    }
    testing::internal::AssertHelper::AssertHelper
              (&AStack_108,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/no_field_presence_map_test.cc"
               ,0x119,pcVar2);
    testing::internal::AssertHelper::operator=(&AStack_108,(Message *)&local_100);
    testing::internal::AssertHelper::~AssertHelper(&AStack_108);
    if (local_100._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_100._M_head_impl + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar.message_);
  proto2_nofieldpresence_unittest::TestAllMapTypes::~TestAllMapTypes(&message);
  return;
}

Assistant:

TEST(NoFieldPresenceTest, TestNonZeroIntMapEntriesHaveNoPresence) {
  TestAllMapTypes message;
  const Reflection* r = message.GetReflection();
  const Descriptor* desc = message.GetDescriptor();

  const FieldDescriptor* field_map_int32_foreign_enum =
      desc->FindFieldByName("map_int32_foreign_enum");

  // Set nonzero values for key-value pairs and test that.
  (*message.mutable_map_int32_foreign_enum())[99] = FOREIGN_BAZ;

  const google::protobuf::Message& enum_map_entry =
      r->GetRepeatedMessage(message, field_map_int32_foreign_enum, /*index=*/0);

  // Fields in map entries inherit field_presence from file defaults. If a map
  // is a "no presence" field, its key is also considered "no presence" from POV
  // of the descriptor. (Even though the key itself behaves like a normal index
  // with zeroes being valid indices). One day we will change this...
  EXPECT_THAT(enum_map_entry, Not(MapEntryKeyExplicitPresence()));

  // Primitive types inherit presence semantics from the map itself.
  EXPECT_THAT(enum_map_entry, Not(MapEntryValueExplicitPresence()));
}